

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_AActor_A_Pain(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  uint uVar1;
  player_t *ppVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  FSoundID *sound_id;
  AActor *ent;
  char *pcVar6;
  bool bVar7;
  FString pain_sound;
  FString local_30;
  FSoundID local_28;
  FSoundID local_24;
  PClass *pPVar5;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003f6c0c;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003f6bfc:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f6c0c:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0xd1d,"int AF_AActor_A_Pain(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  ent = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (ent == (AActor *)0x0) goto LAB_003f6a9e;
    pPVar5 = (ent->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
      (ent->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar7 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar7) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar7 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar7) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f6c0c;
    }
  }
  else {
    if (ent != (AActor *)0x0) goto LAB_003f6bfc;
LAB_003f6a9e:
    ent = (AActor *)0x0;
  }
  ppVar2 = ent->player;
  if ((ppVar2 == (player_t *)0x0) || (ppVar2->morphTics != 0)) {
    local_28.ID = (ent->PainSound).super_FSoundID.ID;
    if (local_28.ID == 0) {
      return 0;
    }
    sound_id = &local_28;
    goto LAB_003f6bd7;
  }
  uVar1 = ent->health;
  if ((int)uVar1 < 0x19) {
    pcVar6 = "*pain25";
  }
  else if (uVar1 < 0x32) {
    pcVar6 = "*pain50";
  }
  else {
    pcVar6 = "*pain100";
    if (uVar1 < 0x4b) {
      pcVar6 = "*pain75";
    }
  }
  if ((ppVar2->LastDamageType).Index == 0) {
LAB_003f6bc6:
    local_24.ID = S_FindSound(pcVar6);
  }
  else {
    FString::FString(&local_30,pcVar6);
    FString::operator+=(&local_30,'-');
    FString::operator+=(&local_30,
                        FName::NameData.NameArray[(ent->player->LastDamageType).Index].Text);
    local_24.ID = S_FindSound(local_30.Chars);
    if (local_24.ID == 0) {
      FString::operator=(&local_30,"*pain-");
      FString::operator+=(&local_30,
                          FName::NameData.NameArray[(ent->player->LastDamageType).Index].Text);
      local_24.ID = S_FindSound(local_30.Chars);
      FString::~FString(&local_30);
      if (local_24.ID == 0) goto LAB_003f6bc6;
    }
    else {
      FString::~FString(&local_30);
    }
  }
  sound_id = &local_24;
LAB_003f6bd7:
  S_Sound(ent,2,sound_id,1.0,1.0);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Pain)
{
	PARAM_SELF_PROLOGUE(AActor);

	// [RH] Vary player pain sounds depending on health (ala Quake2)
	if (self->player && self->player->morphTics == 0)
	{
		const char *pain_amount;
		FSoundID sfx_id;

		if (self->health < 25)
			pain_amount = "*pain25";
		else if (self->health < 50)
			pain_amount = "*pain50";
		else if (self->health < 75)
			pain_amount = "*pain75";
		else
			pain_amount = "*pain100";

		// Try for damage-specific sounds first.
		if (self->player->LastDamageType != NAME_None)
		{
			FString pain_sound = pain_amount;
			pain_sound += '-';
			pain_sound += self->player->LastDamageType;
			sfx_id = pain_sound;
			if (sfx_id == 0)
			{
				// Try again without a specific pain amount.
				pain_sound = "*pain-";
				pain_sound += self->player->LastDamageType;
				sfx_id = pain_sound;
			}
		}
		if (sfx_id == 0)
		{
			sfx_id = pain_amount;
		}

		S_Sound (self, CHAN_VOICE, sfx_id, 1, ATTN_NORM);
	}
	else if (self->PainSound)
	{
		S_Sound (self, CHAN_VOICE, self->PainSound, 1, ATTN_NORM);
	}
	return 0;
}